

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

settings_w * open_settings_w(char *sessionname,char **errmsg)

{
  char *path;
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  settings_w *psVar4;
  int *piVar5;
  
  *errmsg = (char *)0x0;
  path = make_filename(0,(char *)0x0);
  pcVar1 = make_dir_path(path,0x1c0);
  if (pcVar1 == (char *)0x0) {
    safefree(path);
    path = make_filename(4,(char *)0x0);
    pcVar1 = make_dir_path(path,0x1c0);
    if (pcVar1 == (char *)0x0) {
      safefree(path);
      path = make_filename(5,sessionname);
      pFVar3 = fopen(path,"w");
      if (pFVar3 != (FILE *)0x0) {
        safefree(path);
        psVar4 = (settings_w *)safemalloc(1,8,0);
        psVar4->fp = (FILE *)pFVar3;
        return psVar4;
      }
      piVar5 = __errno_location();
      pcVar1 = strerror(*piVar5);
      pcVar1 = dupprintf("Unable to save session: open(\"%s\") returned \'%s\'",path,pcVar1);
      *errmsg = pcVar1;
      goto LAB_0013dee5;
    }
  }
  pcVar2 = dupprintf("Unable to save session: %s",pcVar1);
  *errmsg = pcVar2;
  safefree(pcVar1);
LAB_0013dee5:
  safefree(path);
  return (settings_w *)0x0;
}

Assistant:

settings_w *open_settings_w(const char *sessionname, char **errmsg)
{
    char *filename, *err;
    FILE *fp;

    *errmsg = NULL;

    /*
     * Start by making sure the .putty directory and its sessions
     * subdir actually exist.
     */
    filename = make_filename(INDEX_DIR, NULL);
    if ((err = make_dir_path(filename, 0700)) != NULL) {
        *errmsg = dupprintf("Unable to save session: %s", err);
        sfree(err);
        sfree(filename);
        return NULL;
    }
    sfree(filename);

    filename = make_filename(INDEX_SESSIONDIR, NULL);
    if ((err = make_dir_path(filename, 0700)) != NULL) {
        *errmsg = dupprintf("Unable to save session: %s", err);
        sfree(err);
        sfree(filename);
        return NULL;
    }
    sfree(filename);

    filename = make_filename(INDEX_SESSION, sessionname);
    fp = fopen(filename, "w");
    if (!fp) {
        *errmsg = dupprintf("Unable to save session: open(\"%s\") "
                            "returned '%s'", filename, strerror(errno));
        sfree(filename);
        return NULL;                   /* can't open */
    }
    sfree(filename);

    settings_w *toret = snew(settings_w);
    toret->fp = fp;
    return toret;
}